

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O0

int depspawn::internal::
    fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int,int),boost::add_reference<mpl_::arg<_1>>>,1l>,int&>
              (arg_info **args,int *h)

{
  int iVar1;
  arg_info *this;
  arg_info *in_RSI;
  arg_info **in_RDI;
  arg_info *n;
  int process_argument;
  bool is_barray;
  bool is_writable;
  bool is_const;
  bool is_reference;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  
  uVar6 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  uVar2 = 1;
  this = (arg_info *)
         LinkedListPool<depspawn::internal::arg_info,_true,_false>::malloc
                   ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)arg_info::Pool,
                    (size_t)in_RSI);
  this->size = 4;
  this->wr = false;
  this->next = (arg_info *)0x0;
  arg_info::fill_in_array<int>(this,(int *)in_RSI);
  arg_info::insert_in_arglist
            (in_RSI,(arg_info **)
                    CONCAT17(uVar6,CONCAT16(uVar5,CONCAT15(uVar4,CONCAT14(uVar3,uVar2)))));
  iVar1 = fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int,int),boost::add_reference<mpl_::arg<_1>>>,2l>>
                    (in_RDI);
  return iVar1 + 1;
}

Assistant:

int fill_args(arg_info*& args, Head&& h, Tail&&... t) {
      typedef typename boost::mpl::deref<T_it>::type curr_t;    //Formal parameter type
      constexpr bool is_reference = std::is_reference<curr_t>::value;
      typedef typename std::remove_reference<curr_t>::type deref_t;
      constexpr bool is_const = std::is_const<deref_t>::value;
      constexpr bool is_writable = is_reference && !is_const;
      constexpr bool is_barray = is_blitz_array<typename std::remove_const<typename std::remove_reference<Head>::type>::type>::value;
      constexpr int process_argument =
      !is_ignored<curr_t&&>::value &&
      !is_ignored<Head&&>::value &&
      !(std::is_rvalue_reference<Head&&>::value && !is_barray);
      
      if(process_argument) {
	
        arg_info* n = arg_info::Pool.malloc();
	n->size = sizeof(Head);
	n->wr = is_writable;
	n->next = nullptr;
	n->fill_in_array(h);
	
	// Insert new_arg (n) in order
	n->insert_in_arglist(args);
      }
      
      return process_argument + fill_args<typename boost::mpl::next<T_it>::type>(args, std::forward<Tail>(t)...);
    }